

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

U64 __thiscall
USBPacket::AddDataStageFrames
          (USBPacket *this,USBAnalyzerResults *pResults,USBControlTransferParser *parser,U8 address)

{
  U8 address_local;
  USBControlTransferParser *parser_local;
  USBAnalyzerResults *pResults_local;
  USBPacket *this_local;
  
  AddSyncAndPidFrames(this,pResults,FF_None);
  USBControlTransferParser::ParseDataPacket(parser,this);
  AddCRC16Frame(this,pResults);
  AddEOPFrame(this,pResults);
  AnalyzerResults::CommitResults();
  return this->mSampleEnd;
}

Assistant:

U64 USBPacket::AddDataStageFrames( USBAnalyzerResults* pResults, USBControlTransferParser& parser, U8 address )
{
    AddSyncAndPidFrames( pResults );

    parser.ParseDataPacket( *this );

    AddCRC16Frame( pResults );
    AddEOPFrame( pResults );

    pResults->CommitResults();

    return mSampleEnd;
}